

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O3

void coda_expression_delete(coda_expression *expr)

{
  coda_expression_operation *opexpr;
  long lVar1;
  
  if (2 < expr->tag - expr_constant_boolean) {
    if (expr->tag - expr_constant_rawstring < 2) {
      if (*(void **)&expr[1].is_constant != (void *)0x0) {
        free(*(void **)&expr[1].is_constant);
      }
    }
    else {
      if (*(void **)(expr + 1) != (void *)0x0) {
        free(*(void **)(expr + 1));
      }
      lVar1 = 0;
      do {
        if (*(coda_expression **)(&expr[1].is_constant + lVar1 * 2) != (coda_expression *)0x0) {
          coda_expression_delete(*(coda_expression **)(&expr[1].is_constant + lVar1 * 2));
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 != 4);
    }
  }
  free(expr);
  return;
}

Assistant:

LIBCODA_API void coda_expression_delete(coda_expression *expr)
{
    switch (expr->tag)
    {
        case expr_constant_boolean:
        case expr_constant_float:
        case expr_constant_integer:
            break;
        case expr_constant_rawstring:
        case expr_constant_string:
            if (((coda_expression_string_constant *)expr)->value != NULL)
            {
                free(((coda_expression_string_constant *)expr)->value);
            }
            break;
        default:
            {
                coda_expression_operation *opexpr;
                int i;

                opexpr = (coda_expression_operation *)expr;
                if (opexpr->identifier != NULL)
                {
                    free(opexpr->identifier);
                }
                for (i = 0; i < 4; i++)
                {
                    if (opexpr->operand[i] != NULL)
                    {
                        coda_expression_delete(opexpr->operand[i]);
                    }
                }
            }
            break;
    }
    free(expr);
}